

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mainEth1394.cpp
# Opt level: O0

void TestDacRW(BasePort *port,uchar boardNum)

{
  uint uVar1;
  __uint32_t _Var2;
  unsigned_long uVar3;
  long lVar4;
  ostream *poVar5;
  void *pvVar6;
  nodeaddr_t addr;
  unsigned_long fver;
  size_t numQuads;
  size_t i0;
  quadlet_t write_block [6];
  size_t i;
  uchar boardNum_local;
  BasePort *port_local;
  
  fver = 5;
  uVar3 = BasePort::GetFirmwareVersion(port,boardNum);
  if (7 < uVar3) {
    fver = 6;
  }
  numQuads = (size_t)(7 < uVar3);
  write_block[4] = 0;
  write_block[5] = 0;
  for (; (ulong)write_block._16_8_ < 4; write_block._16_8_ = write_block._16_8_ + 1) {
    lVar4 = write_block._16_8_ + 1;
    write_block[numQuads + write_block._16_8_ + -2] = 0;
    uVar1 = (*port->_vptr_BasePort[0x23])
                      (port,(ulong)boardNum,lVar4 * 0x10 | 1,
                       write_block + numQuads + write_block._16_8_ + -2);
    if ((uVar1 & 1) == 0) {
      poVar5 = std::operator<<((ostream *)&std::cout,"Failed to read quadlet for channel ");
      pvVar6 = (void *)std::ostream::operator<<(poVar5,write_block._16_8_ + 1);
      std::ostream::operator<<(pvVar6,std::endl<char,std::char_traits<char>>);
    }
    write_block[numQuads + write_block._16_8_ + -2] =
         write_block[numQuads + write_block._16_8_ + -2] & 0xffff;
  }
  poVar5 = std::operator<<((ostream *)&std::cout,"Read from DAC: ");
  pvVar6 = (void *)std::ostream::operator<<(poVar5,std::hex);
  poVar5 = (ostream *)std::ostream::operator<<(pvVar6,write_block[numQuads - 2]);
  poVar5 = std::operator<<(poVar5,", ");
  poVar5 = (ostream *)std::ostream::operator<<(poVar5,write_block[numQuads - 1]);
  poVar5 = std::operator<<(poVar5,", ");
  poVar5 = (ostream *)std::ostream::operator<<(poVar5,write_block[numQuads]);
  poVar5 = std::operator<<(poVar5,", ");
  pvVar6 = (void *)std::ostream::operator<<(poVar5,write_block[numQuads + 1]);
  std::ostream::operator<<(pvVar6,std::endl<char,std::char_traits<char>>);
  if (7 < uVar3) {
    i0._0_4_ = __bswap_32((uint)boardNum << 8 | (uint)fver);
  }
  write_block[4] = 0;
  write_block[5] = 0;
  for (; (ulong)write_block._16_8_ < 4; write_block._16_8_ = write_block._16_8_ + 1) {
    _Var2 = __bswap_32(write_block[numQuads + write_block._16_8_ + -2] +
                       ((quadlet_t)write_block._16_8_ + 1) * 0x100 | 0x80000000);
    write_block[numQuads + write_block._16_8_ + -2] = _Var2;
    if (uVar3 < 8) {
      write_block[numQuads + write_block._16_8_ + -2] =
           (uint)boardNum << 0x18 | write_block[numQuads + write_block._16_8_ + -2];
    }
  }
  write_block[fver - 3] = 0;
  poVar5 = std::operator<<((ostream *)&std::cout,"Setting new values");
  std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
  uVar1 = (*port->_vptr_BasePort[0x27])(port,(ulong)boardNum,0,&i0,fver << 2);
  if ((uVar1 & 1) == 0) {
    poVar5 = std::operator<<((ostream *)&std::cout,"Failed to write block data");
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
  }
  return;
}

Assistant:

void TestDacRW(BasePort *port, unsigned char boardNum)
{
    size_t i;
    quadlet_t write_block[6];

    size_t i0 = 0;
    size_t numQuads = 5;
    unsigned long fver = port->GetFirmwareVersion(boardNum);
    if (fver > 7) {
        i0 = 1;
        numQuads = 6;
    }

    // Read from DAC (quadlet reads), modify values, write them using
    // a block write.
    for (i = 0; i < 4; i++) {
        nodeaddr_t addr = 0x0001 | ((i+1) << 4);  // channel 1-4, DAC Control
        write_block[i0+i] = 0;
        if (!port->ReadQuadlet(boardNum, addr, write_block[i0+i]))
            std::cout << "Failed to read quadlet for channel " << (i+1) << std::endl;
        write_block[i0+i] &= 0x0000ffff;
    }
    std::cout << "Read from DAC: " << std::hex << write_block[i0+0] << ", "
              << write_block[i0+1] << ", " << write_block[i0+2] << ", "
              << write_block[i0+3] << std::endl;
    if (fver > 7) {
        write_block[0] = bswap_32(static_cast<quadlet_t>((boardNum << 8) | numQuads));
    }
    for (i = 0; i < 4; i++) {
        write_block[i0+i] = bswap_32(VALID_BIT | (write_block[i0+i]+static_cast<quadlet_t>(i+1)*0x100));
        if (fver < 8)
            write_block[i0+i] |= (boardNum<<24);
    }
    write_block[numQuads-1] = 0;   // power control
    std::cout << "Setting new values" << std::endl;
    if (!port->WriteBlock(boardNum, 0, write_block, numQuads*sizeof(quadlet_t)))
        std::cout << "Failed to write block data" << std::endl;
}